

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clock.cpp
# Opt level: O1

void showClock(void)

{
  int ledIndex;
  int ledIndex_00;
  int iVar1;
  tm *ptVar2;
  RGB *pRVar3;
  long lVar4;
  time_t t;
  RGB local_3b;
  time_t local_38;
  
  WS2812B::Led::clear(&leds);
  lVar4 = 0;
  local_38 = time((time_t *)0x0);
  ptVar2 = localtime(&local_38);
  ledIndex = ptVar2->tm_sec;
  ledIndex_00 = ptVar2->tm_min;
  iVar1 = ptVar2->tm_hour;
  do {
    local_3b._r = '\x0f';
    local_3b._g = '\x0f';
    local_3b._b = '\x0f';
    WS2812B::Led::setColor(&leds,&local_3b,(int)lVar4);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x1a);
  pRVar3 = WS2812B::Led::getColor(&leds,ledIndex);
  pRVar3->_b = '\x7f';
  pRVar3 = WS2812B::Led::getColor(&leds,ledIndex_00);
  pRVar3->_g = '\x7f';
  pRVar3 = WS2812B::Led::getColor
                     (&leds,ledIndex_00 / 0xf +
                            (iVar1 + (((uint)(iVar1 / 6 + (iVar1 >> 0x1f)) >> 1) - (iVar1 >> 0x1f))
                                     * -0xc) * 2);
  pRVar3->_r = '\x7f';
  WS2812B::Led::show(&leds);
  sleep(1);
  return;
}

Assistant:

void showClock() {

    leds.clear();
    time_t t = ::time(nullptr);
    tm *l_t = ::localtime(&t);

    int sec = l_t->tm_sec;
    int min = l_t->tm_min;
    int hour = l_t->tm_hour;

    for (size_t hourDividerIndex = 0; hourDividerIndex <= 12; hourDividerIndex++) {
        leds.setColor(WS2812B::RGB(LOW_WHITE), hourDividerIndex * (NUM_LEDS / 12));
    }

    leds.getColor(sec).setB(HIGH_LIGHT0);
    leds.getColor(min).setG(HIGH_LIGHT0);
    leds.getColor((NUM_LEDS / 12) * (hour % 12) + (min / 15)).setR(HIGH_LIGHT0);
    leds.show();
    sleep(1);
}